

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void alloc_compressor_data(AV1_COMP *cpi)

{
  int iVar1;
  MvCosts *pMVar2;
  PICK_MODE_CONTEXT *pPVar3;
  AV1_COMP *in_RDI;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  ThreadData_conflict *in_stack_00000040;
  AV1_COMP *in_stack_00000048;
  AV1_COMP *in_stack_00000060;
  PC_TREE_SHARED_BUFFERS *in_stack_000001b8;
  BLOCK_SIZE in_stack_000001c7;
  AV1_COMP *in_stack_000001c8;
  AV1_COMMON *memblk;
  
  memblk = &in_RDI->common;
  (*(in_RDI->common).mi_params.set_mb_mi)
            (&(in_RDI->common).mi_params,(in_RDI->common).width,(in_RDI->common).height,
             (in_RDI->sf).part_sf.default_min_partition_size);
  iVar1 = is_stat_generation_stage(in_RDI);
  if (iVar1 == 0) {
    av1_alloc_txb_buf(in_stack_00000060);
  }
  aom_free(memblk);
  (in_RDI->td).mv_costs_alloc = (MvCosts *)0x0;
  if ((in_RDI->oxcf).kf_cfg.key_freq_max != 0) {
    pMVar2 = (MvCosts *)aom_calloc((size_t)in_RDI,(size_t)memblk);
    (in_RDI->td).mv_costs_alloc = pMVar2;
    if ((in_RDI->td).mv_costs_alloc == (MvCosts *)0x0) {
      aom_internal_error(memblk->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->td.mv_costs_alloc");
    }
    (in_RDI->td).mb.mv_costs = (in_RDI->td).mv_costs_alloc;
  }
  av1_setup_shared_coeff_buffer
            ((SequenceHeader *)cpi,(PC_TREE_SHARED_BUFFERS *)cm,(aom_internal_error_info *)mi_params
            );
  iVar1 = av1_setup_sms_tree(in_stack_00000048,in_stack_00000040);
  if (iVar1 != 0) {
    aom_internal_error(memblk->error,AOM_CODEC_MEM_ERROR,"Failed to allocate SMS tree");
  }
  pPVar3 = av1_alloc_pmc(in_stack_000001c8,in_stack_000001c7,in_stack_000001b8);
  (in_RDI->td).firstpass_ctx = pPVar3;
  if ((in_RDI->td).firstpass_ctx == (PICK_MODE_CONTEXT *)0x0) {
    aom_internal_error(memblk->error,AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
  }
  return;
}

Assistant:

static inline void alloc_compressor_data(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CommonModeInfoParams *const mi_params = &cm->mi_params;

  // Setup mi_params
  mi_params->set_mb_mi(mi_params, cm->width, cm->height,
                       cpi->sf.part_sf.default_min_partition_size);

  if (!is_stat_generation_stage(cpi)) av1_alloc_txb_buf(cpi);

  aom_free(cpi->td.mv_costs_alloc);
  cpi->td.mv_costs_alloc = NULL;
  // Avoid the memory allocation of 'mv_costs_alloc' for allintra encoding
  // mode.
  if (cpi->oxcf.kf_cfg.key_freq_max != 0) {
    CHECK_MEM_ERROR(cm, cpi->td.mv_costs_alloc,
                    (MvCosts *)aom_calloc(1, sizeof(*cpi->td.mv_costs_alloc)));
    cpi->td.mb.mv_costs = cpi->td.mv_costs_alloc;
  }

  av1_setup_shared_coeff_buffer(cm->seq_params, &cpi->td.shared_coeff_buf,
                                cm->error);
  if (av1_setup_sms_tree(cpi, &cpi->td)) {
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate SMS tree");
  }
  cpi->td.firstpass_ctx =
      av1_alloc_pmc(cpi, BLOCK_16X16, &cpi->td.shared_coeff_buf);
  if (!cpi->td.firstpass_ctx)
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate PICK_MODE_CONTEXT");
}